

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
          *field)

{
  size_t *psVar1;
  pointer *pppEVar2;
  ElemSegmentModuleField *pEVar3;
  iterator __position;
  ModuleField *pMVar4;
  ModuleFieldList *pMVar5;
  ElemSegment *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pEVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
  if (*(size_type *)((long)&(pEVar3->elem_segment).name + 8) != 0) {
    local_48 = (ElemSegment *)
               (((Location *)
                ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField
                + 0x18))->filename).data_;
    uStack_40 = *(undefined4 *)
                 ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->elem_segments).
                              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->elem_segments).
                             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->elem_segment_bindings,0,&(pEVar3->elem_segment).name);
  }
  local_48 = &pEVar3->elem_segment;
  __position._M_current =
       (this->elem_segments).
       super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::ElemSegment*,std::allocator<wabt::ElemSegment*>>::
    _M_realloc_insert<wabt::ElemSegment*>
              ((vector<wabt::ElemSegment*,std::allocator<wabt::ElemSegment*>> *)&this->elem_segments
               ,__position,&local_48);
  }
  else {
    *__position._M_current = local_48;
    pppEVar2 = &(this->elem_segments).
                super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + 1;
  }
  pEVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (ElemSegmentModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar4 = (this->fields).last_;
    if (pMVar4 == (ModuleField *)0x0) {
      pMVar5 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pEVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField + 0x10)
           = pMVar4;
      pMVar5 = (ModuleFieldList *)&pMVar4->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar5->first_ = (ModuleField *)pEVar3;
    (this->fields).last_ = (ModuleField *)pEVar3;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<ElemSegmentModuleField> field) {
  ElemSegment& elem_segment = field->elem_segment;
  if (!elem_segment.name.empty()) {
    elem_segment_bindings.emplace(elem_segment.name,
                                  Binding(field->loc, elem_segments.size()));
  }
  elem_segments.push_back(&elem_segment);
  fields.push_back(std::move(field));
}